

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_convert.cpp
# Opt level: O3

void test_normc<wchar_t>(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                         *orig,basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *normal,norm_type type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pwVar2;
  pointer pwVar3;
  size_type sVar4;
  _Alloc_hider _Var5;
  int iVar6;
  converter<wchar_t> *pcVar7;
  ostream *poVar8;
  runtime_error *prVar9;
  pointer pwVar10;
  bool bVar11;
  locale l;
  string local_60;
  string local_40 [8];
  generator local_38 [8];
  
  booster::locale::generator::generator(local_38);
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"en_US.UTF-8","");
  booster::locale::generator::generate(local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  booster::locale::generator::~generator(local_38);
  test_counter = test_counter + 1;
  pcVar7 = std::use_facet<booster::locale::converter<wchar_t>>((locale *)local_40);
  pwVar10 = (orig->_M_dataplus)._M_p;
  (**(code **)(*(long *)pcVar7 + 0x10))
            (&local_60,pcVar7,0,pwVar10,pwVar10 + orig->_M_string_length,type);
  _Var5._M_p = local_60._M_dataplus._M_p;
  if (local_60._M_string_length == normal->_M_string_length) {
    if (local_60._M_string_length == 0) {
      bVar11 = true;
    }
    else {
      iVar6 = wmemcmp((wchar_t *)local_60._M_dataplus._M_p,(normal->_M_dataplus)._M_p,
                      local_60._M_string_length);
      bVar11 = iVar6 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p != paVar1) {
    operator_delete(_Var5._M_p);
  }
  if (!bVar11) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," normalize(orig,type,l)==normal",0x1f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar6 = error_counter + 1;
    bVar11 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar11) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_60._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar9,&local_60);
      __cxa_throw(prVar9,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pwVar3 = (orig->_M_dataplus)._M_p;
  pwVar10 = pwVar3 + -1;
  do {
    pwVar2 = pwVar10 + 1;
    pwVar10 = pwVar10 + 1;
  } while (*pwVar2 != L'\0');
  pcVar7 = std::use_facet<booster::locale::converter<wchar_t>>((locale *)local_40);
  (**(code **)(*(long *)pcVar7 + 0x10))(&local_60,pcVar7,0,pwVar3,pwVar10,type);
  _Var5._M_p = local_60._M_dataplus._M_p;
  if (local_60._M_string_length == normal->_M_string_length) {
    if (local_60._M_string_length == 0) {
      bVar11 = true;
    }
    else {
      iVar6 = wmemcmp((wchar_t *)local_60._M_dataplus._M_p,(normal->_M_dataplus)._M_p,
                      local_60._M_string_length);
      bVar11 = iVar6 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p != paVar1) {
    operator_delete(_Var5._M_p);
  }
  if (!bVar11) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," normalize(orig.c_str(),type,l)==normal",0x27);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar6 = error_counter + 1;
    bVar11 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar11) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_60._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar9,&local_60);
      __cxa_throw(prVar9,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  pwVar10 = (orig->_M_dataplus)._M_p;
  sVar4 = orig->_M_string_length;
  pcVar7 = std::use_facet<booster::locale::converter<wchar_t>>((locale *)local_40);
  (**(code **)(*(long *)pcVar7 + 0x10))(&local_60,pcVar7,0,pwVar10,pwVar10 + sVar4,type);
  _Var5._M_p = local_60._M_dataplus._M_p;
  if (local_60._M_string_length == normal->_M_string_length) {
    if (local_60._M_string_length == 0) {
      bVar11 = true;
    }
    else {
      iVar6 = wmemcmp((wchar_t *)local_60._M_dataplus._M_p,(normal->_M_dataplus)._M_p,
                      local_60._M_string_length);
      bVar11 = iVar6 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p != paVar1) {
    operator_delete(_Var5._M_p);
  }
  if (!bVar11) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," normalize(orig.c_str(),orig.c_str()+orig.size(),type,l)==normal",0x40);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    iVar6 = error_counter + 1;
    bVar11 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar11) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_60._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar9,&local_60);
      __cxa_throw(prVar9,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::~locale((locale *)local_40);
  return;
}

Assistant:

void test_normc(std::basic_string<Char> orig,std::basic_string<Char> normal,booster::locale::norm_type type)
{
    std::locale l = booster::locale::generator().generate("en_US.UTF-8");
    TEST(normalize(orig,type,l)==normal);
    TEST(normalize(orig.c_str(),type,l)==normal);
    TEST(normalize(orig.c_str(),orig.c_str()+orig.size(),type,l)==normal);
}